

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::AndroidLogConfig::ParseFromArray
          (AndroidLogConfig *this,void *raw,size_t size)

{
  pointer pAVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t *end;
  uint uVar9;
  ulong uVar10;
  uint64_t int_value;
  uint64_t payload_length;
  AndroidLogConfig *local_70;
  uint64_t preamble;
  uint32_t local_60;
  ushort local_5c;
  uint8_t local_5a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  vector<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
  *local_48;
  bitset<5UL> *local_40;
  uint64_t payload_length_1;
  
  pAVar1 = (this->log_ids_).
           super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->log_ids_).
      super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
      ._M_impl.super__Vector_impl_data._M_finish != pAVar1) {
    (this->log_ids_).
    super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar1;
  }
  local_48 = &this->log_ids_;
  local_50 = &this->filter_tags_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_50);
  local_58 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar8 = 0;
  local_70 = this;
  do {
    if (end <= raw) goto switchD_002b54cb_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar5 != (uint64_t *)raw) goto LAB_002b5492;
LAB_002b5818:
      uVar8 = 0;
      uVar6 = 0;
      goto LAB_002b55d0;
    }
    puVar5 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002b5492:
    uVar2 = preamble;
    uVar10 = preamble >> 3;
    uVar9 = (uint)uVar10;
    if ((uVar9 == 0) || (end <= puVar5)) goto LAB_002b5818;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&int_value);
      uVar7 = 0;
      uVar6 = 0;
      if (puVar4 == puVar5) goto LAB_002b55d0;
      break;
    case 1:
      puVar4 = puVar5 + 1;
      if (end < puVar4) goto switchD_002b54cb_caseD_3;
      int_value = *puVar5;
LAB_002b5517:
      uVar7 = 0;
      break;
    case 2:
      puVar3 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar5,(uint8_t *)end,&payload_length)
      ;
      if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length))
      goto switchD_002b54cb_caseD_3;
      puVar4 = (uint64_t *)((long)puVar3 + payload_length);
      uVar7 = payload_length;
      int_value = (uint64_t)puVar3;
      break;
    default:
      goto switchD_002b54cb_caseD_3;
    case 5:
      puVar4 = (uint64_t *)((long)puVar5 + 4);
      if (puVar4 <= end) {
        int_value = (uint64_t)(uint)*puVar5;
        goto LAB_002b5517;
      }
      goto switchD_002b54cb_caseD_3;
    }
    raw = puVar4;
  } while ((0xffff < uVar9) || (0xfffffff < uVar7));
  uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
  uVar6 = int_value;
LAB_002b55d0:
  local_40 = &local_70->_has_field_;
LAB_002b55e1:
  do {
    preamble = uVar6;
    local_60 = (uint32_t)uVar8;
    local_5a = (uint8_t)(uVar8 >> 0x30);
    uVar9 = (uint)(uVar8 >> 0x20);
    local_5c = (ushort)(uVar8 >> 0x20);
    if (local_5c == 0) {
      return end == (uint64_t *)raw;
    }
    if (local_5c < 5) {
      ::std::bitset<5UL>::set((bitset<5UL> *)local_40,(ulong)(uVar9 & 7),true);
      uVar9 = (uint)local_5c;
    }
    if ((short)uVar9 == 4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(local_50);
      protozero::Field::get
                ((Field *)&preamble,
                 (local_70->filter_tags_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1);
    }
    else if ((uVar9 & 0xffff) == 3) {
      local_70->min_prio_ = (AndroidLogId)preamble;
    }
    else if ((uVar9 & 0xffff) == 1) {
      std::
      vector<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
      ::emplace_back<>(local_48);
      (local_70->log_ids_).
      super__Vector_base<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = (AndroidLogId)preamble;
    }
    else {
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                ((Field *)&preamble,local_58);
    }
    do {
      if (end <= raw) {
LAB_002b57f5:
        uVar8 = 0;
        uVar6 = 0;
        goto LAB_002b55e1;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar5 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar5 == (uint64_t *)raw) goto LAB_002b57f5;
      }
      else {
        puVar5 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar2 = int_value;
      uVar10 = int_value >> 3;
      uVar9 = (uint)uVar10;
      if ((uVar9 == 0) || (end <= puVar5)) goto LAB_002b57f5;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length);
        uVar7 = 0;
        uVar8 = 0;
        uVar6 = 0;
        if (puVar4 == puVar5) goto LAB_002b55e1;
        break;
      case 1:
        puVar4 = puVar5 + 1;
        if (end < puVar4) goto switchD_002b56fd_caseD_3;
        payload_length = *puVar5;
LAB_002b5754:
        uVar7 = 0;
        break;
      case 2:
        puVar3 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar5,(uint8_t *)end,&payload_length_1);
        if ((puVar3 == puVar5) || ((ulong)((long)end - (long)puVar3) < payload_length_1))
        goto switchD_002b56fd_caseD_3;
        puVar4 = (uint64_t *)((long)puVar3 + payload_length_1);
        uVar7 = payload_length_1;
        payload_length = (uint64_t)puVar3;
        break;
      default:
        goto switchD_002b56fd_caseD_3;
      case 5:
        puVar4 = (uint64_t *)((long)puVar5 + 4);
        if (puVar4 <= end) {
          payload_length = (uint64_t)(uint)*puVar5;
          goto LAB_002b5754;
        }
        goto switchD_002b56fd_caseD_3;
      }
      raw = puVar4;
    } while ((0xffff < uVar9) || (0xfffffff < uVar7));
    uVar8 = uVar7 | (uVar2 & 7) << 0x30 | uVar10 << 0x20;
    uVar6 = payload_length;
  } while( true );
switchD_002b54cb_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_002b55d0;
switchD_002b56fd_caseD_3:
  uVar8 = 0;
  uVar6 = 0;
  goto LAB_002b55e1;
}

Assistant:

bool AndroidLogConfig::ParseFromArray(const void* raw, size_t size) {
  log_ids_.clear();
  filter_tags_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* log_ids */:
        log_ids_.emplace_back();
        field.get(&log_ids_.back());
        break;
      case 3 /* min_prio */:
        field.get(&min_prio_);
        break;
      case 4 /* filter_tags */:
        filter_tags_.emplace_back();
        field.get(&filter_tags_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}